

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC2TL1SLHDMultiThread4Test
          (DatarateTestSVC *this)

{
  undefined1 uVar1;
  bool bVar2;
  ParamType *file;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  string *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  Y4mVideoSource video;
  char (*in_stack_fffffffffffffe18) [63];
  Y4mVideoSource *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  Message *in_stack_fffffffffffffe30;
  undefined4 uVar4;
  undefined2 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3e;
  undefined8 in_stack_fffffffffffffe40;
  Type type;
  Y4mVideoSource *this_00;
  AssertionResult local_190 [2];
  double local_170;
  Message *in_stack_fffffffffffffe98;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffea0;
  int local_154;
  HasNewFatalFailureHelper local_138;
  undefined8 local_120 [3];
  undefined1 local_101 [33];
  undefined1 local_e0 [224];
  
  *(undefined4 *)&in_RDI[6].field_2 = 500;
  *(undefined4 *)((long)&in_RDI[6].field_2 + 4) = 500;
  *(undefined4 *)((long)&in_RDI[6]._M_string_length + 4) = 1000;
  *(undefined4 *)((long)&in_RDI[3]._M_string_length + 4) = 0;
  *(undefined4 *)((long)&in_RDI[5].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 6) = 0x3f;
  *(undefined4 *)&in_RDI[4].field_2 = 1;
  *(undefined4 *)&in_RDI[3]._M_string_length = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 4) = 4;
  this_00 = (Y4mVideoSource *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_101 + 1),"niklas_1280_720_30.y4m",(allocator *)this_00);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            (this_00,in_RDI,(uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),
             (int)in_stack_fffffffffffffe40);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  local_120[0] = 0x4b000000258;
  file = testing::
         WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
         ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7d3671);
  *(undefined4 *)((long)&in_RDI[5].field_2 + 8) =
       *(undefined4 *)((long)local_120 + (long)*p_Var3 * 4);
  (**(code **)(*(long *)in_RDI + 0x40))();
  *(undefined4 *)((long)&in_RDI[0x22].field_2 + 8) = 1;
  *(undefined4 *)((long)&in_RDI[0x22].field_2 + 0xc) = 1;
  *(undefined4 *)&in_RDI[0x27].field_2 = 2;
  *(undefined4 *)((long)&in_RDI[0x27].field_2 + 4) = 1;
  *(uint *)((long)&in_RDI[0x27].field_2 + 8) =
       (uint)(*(int *)((long)&in_RDI[5].field_2 + 8) * 0x3c) / 100;
  *(undefined4 *)((long)&in_RDI[0x27].field_2 + 0xc) = *(undefined4 *)((long)&in_RDI[5].field_2 + 8)
  ;
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)this_00);
    in_stack_fffffffffffffe3e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe3e) {
      (**(code **)(*(long *)((long)&in_RDI->field_2 + 8) + 0x10))
                ((undefined1 *)((long)&in_RDI->field_2 + 8),local_e0);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_138);
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffe20);
    if (!bVar2) {
      uVar4 = 0;
      for (local_154 = 0;
          local_154 < *(int *)&in_RDI[0x27].field_2 * *(int *)((long)&in_RDI[0x27].field_2 + 4);
          local_154 = local_154 + 1) {
        local_170 = (double)*(int *)((long)&in_RDI[0x27].field_2 + (long)local_154 * 4 + 8) * 0.7;
        testing::internal::CmpHelperGE<double,double>
                  ((char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe3e,
                                                   CONCAT24(in_stack_fffffffffffffe3c,uVar4))),
                   (char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                   (double *)in_stack_fffffffffffffe20);
        bVar2 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffe98);
        if (!bVar2) {
          testing::Message::Message((Message *)this_00);
          in_stack_fffffffffffffe30 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe20,
                          (char (*) [61])in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe28 =
               (double *)testing::AssertionResult::failure_message((AssertionResult *)0x7d39b7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,(Type)((ulong)in_RDI >> 0x20),(char *)file,
                     CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe3c)),
                     (char *)in_stack_fffffffffffffe30);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffea0._M_head_impl,
                     in_stack_fffffffffffffe98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
          testing::Message::~Message((Message *)0x7d3a05);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7d3a86);
        if (!bVar2) break;
        testing::internal::CmpHelperLE<double,double>
                  ((char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe3e,
                                                   CONCAT24(in_stack_fffffffffffffe3c,uVar4))),
                   (char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                   (double *)in_stack_fffffffffffffe20);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(local_190);
        if (!bVar2) {
          testing::Message::Message((Message *)this_00);
          in_stack_fffffffffffffe20 =
               (Y4mVideoSource *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe18 =
               (char (*) [63])testing::AssertionResult::failure_message((AssertionResult *)0x7d3b3b)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,(Type)((ulong)in_RDI >> 0x20),(char *)file,
                     CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe3c)),
                     (char *)in_stack_fffffffffffffe30);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffea0._M_head_impl,
                     in_stack_fffffffffffffe98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
          testing::Message::~Message((Message *)0x7d3b87);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7d3bff);
        if (!bVar2) break;
      }
      goto LAB_007d3c3b;
    }
    if (!bVar2) goto LAB_007d3c3b;
  }
  type = (Type)((ulong)in_RDI >> 0x20);
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,type,(char *)file,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe3c)),
             (char *)in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffea0._M_head_impl,in_stack_fffffffffffffe98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
  testing::Message::~Message((Message *)0x7d3897);
LAB_007d3c3b:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(in_stack_fffffffffffffe20);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC2TL1SLHDMultiThread4Test() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    cfg_.g_threads = 4;

    ::libaom_test::Y4mVideoSource video("niklas_1280_720_30.y4m", 0, 60);
    const int bitrate_array[2] = { 600, 1200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    tile_columns_ = 1;
    tile_rows_ = 1;
    number_temporal_layers_ = 2;
    number_spatial_layers_ = 1;
    target_layer_bitrate_[0] = 60 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.70)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.45)
          << " The datarate for the file is greater than target by too much!";
    }
  }